

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::core::string<unsigned_short>_>::push_back
          (array<irr::core::string<unsigned_short>_> *this,string<unsigned_short> *element)

{
  uint uVar1;
  uint uVar2;
  string<unsigned_short> e;
  string<unsigned_short> sStack_28;
  
  uVar1 = this->used;
  uVar2 = uVar1 + 1;
  if (this->allocated < uVar2) {
    string<unsigned_short>::string(&sStack_28);
    string<unsigned_short>::operator=(&sStack_28,element);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    string<unsigned_short>::operator=(this->data + uVar1,&sStack_28);
    this->is_sorted = false;
    string<unsigned_short>::~string(&sStack_28);
  }
  else {
    this->used = uVar2;
    string<unsigned_short>::operator=(this->data + uVar1,element);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}